

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O2

void __thiscall QAnimationTimer::~QAnimationTimer(QAnimationTimer *this)

{
  *(undefined ***)this = &PTR_metaObject_00667958;
  QArrayDataPointer<QAbstractAnimation_*>::~QArrayDataPointer
            ((QArrayDataPointer<QAbstractAnimation_*> *)(this + 0x60));
  QArrayDataPointer<QAbstractAnimation_*>::~QArrayDataPointer
            ((QArrayDataPointer<QAbstractAnimation_*> *)(this + 0x40));
  QArrayDataPointer<QAbstractAnimation_*>::~QArrayDataPointer
            ((QArrayDataPointer<QAbstractAnimation_*> *)(this + 0x28));
  QObject::~QObject((QObject *)this);
  return;
}

Assistant:

QAnimationTimer::~QAnimationTimer()
    = default;